

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O3

int __thiscall deqp::egl::PartialUpdateTests::init(PartialUpdateTests *this,EVP_PKEY_CTX *ctx)

{
  _anonymous_namespace_ *this_00;
  EglTestContext *pEVar1;
  TestNode *pTVar2;
  int extraout_EAX;
  long *plVar3;
  undefined8 *puVar4;
  PartialUpdateTest *pPVar5;
  pointer pDVar6;
  pointer pDVar7;
  allocator_type *paVar8;
  long *plVar9;
  undefined8 *puVar10;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *extraout_RDX;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *extraout_RDX_00;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *extraout_RDX_01;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *extraout_RDX_02;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *extraout_RDX_03;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *extraout_RDX_04;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *extraout_RDX_05;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *extraout_RDX_06;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  *drawTypes;
  ulong uVar11;
  undefined8 uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_R9;
  _anonymous_namespace_ *this_01;
  string name;
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  frameDrawTypes;
  DrawType renderClear [2];
  DrawType clearRender [2];
  value_type local_128;
  undefined8 uStack_110;
  long *local_108;
  undefined8 local_100;
  long local_f8;
  undefined8 uStack_f0;
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  local_e8;
  long lStack_d0;
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  local_c8;
  _anonymous_namespace_ *local_b0;
  TestNode *local_a8;
  DrawType local_a0 [4];
  string local_90;
  ulong local_70;
  _anonymous_namespace_ *local_68;
  ulong local_60;
  ulong local_58;
  string local_50;
  
  local_a0[2] = DRAWTYPE_GLES2_CLEAR;
  local_a0[3] = DRAWTYPE_GLES2_RENDER;
  local_a0[0] = DRAWTYPE_GLES2_RENDER;
  local_a0[1] = DRAWTYPE_GLES2_CLEAR;
  local_c8.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back(&local_c8,&local_128);
  if (local_128.
      super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_128.
       super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_start + 1;
  *local_128.
   super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
   ._M_impl.super__Vector_impl_data._M_start = DRAWTYPE_GLES2_CLEAR;
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_128.
       super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back(&local_c8,&local_128);
  if (local_128.
      super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(4);
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_128.
       super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_start + 1;
  *local_128.
   super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
   ._M_impl.super__Vector_impl_data._M_start = DRAWTYPE_GLES2_RENDER;
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_128.
       super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back(&local_c8,&local_128);
  if (local_128.
      super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_128.
       super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_start + 2;
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start[0] = DRAWTYPE_GLES2_CLEAR;
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start[1] = DRAWTYPE_GLES2_CLEAR;
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_128.
       super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back(&local_c8,&local_128);
  if (local_128.
      super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
  paVar8 = (allocator_type *)
           ((long)local_128.
                  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                  ._M_impl.super__Vector_impl_data._M_start + 8);
  *(undefined1 **)
   local_128.
   super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
   ._M_impl.super__Vector_impl_data._M_start = &DAT_100000001;
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar8;
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar8;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back(&local_c8,&local_128);
  if ((pointer *)
      local_128.
      super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_128.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>>
              *)&local_128,local_a0 + 2,(DrawType *)&local_90,paVar8);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back(&local_c8,&local_128);
  if ((pointer *)
      local_128.
      super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_128.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>>
  ::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType_const*,void>
            ((vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>>
              *)&local_128,local_a0,local_a0 + 2,paVar8);
  local_a8 = (TestNode *)this;
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::push_back(&local_c8,&local_128);
  drawTypes = extraout_RDX;
  if ((pointer *)
      local_128.
      super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_128.
                    super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    drawTypes = extraout_RDX_00;
  }
  local_b0 = (_anonymous_namespace_ *)
             local_c8.
             super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_c8.
            super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_c8.
            super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    local_58 = ((long)local_c8.
                      super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_c8.
                      super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    local_70 = local_58 + (local_58 == 0);
    uVar11 = 0;
    this_01 = (_anonymous_namespace_ *)
              local_c8.
              super__Vector_base<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      this_00 = local_b0 + uVar11 * 0x18;
      local_68 = this_01;
      local_60 = uVar11;
      do {
        egl::(anonymous_namespace)::generateDrawTypeName_abi_cxx11_(&local_50,this_01,drawTypes);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1b96d07);
        local_e8.
        super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&local_e8.
                       super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        plVar9 = plVar3 + 2;
        if ((pointer *)*plVar3 == (pointer *)plVar9) {
          local_e8.
          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar9;
          lStack_d0 = plVar3[3];
        }
        else {
          local_e8.
          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar9;
          local_e8.
          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar3;
        }
        local_e8.
        super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar3[1];
        *plVar3 = (long)plVar9;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
        local_128.
        super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&local_128.
                       super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        puVar10 = puVar4 + 2;
        if ((pointer *)*puVar4 == (pointer *)puVar10) {
          local_128.
          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*puVar10;
          uStack_110 = puVar4[3];
        }
        else {
          local_128.
          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*puVar10;
          local_128.
          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar4;
        }
        local_128.
        super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar4[1];
        *puVar4 = puVar10;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        egl::(anonymous_namespace)::generateDrawTypeName_abi_cxx11_
                  (&local_90,this_00,
                   (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                    *)local_128.
                      super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
        paVar8 = (allocator_type *)0xf;
        if ((pointer *)
            local_128.
            super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            &local_128.
             super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          paVar8 = (allocator_type *)
                   local_128.
                   super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        if (paVar8 < (allocator_type *)
                     ((long)local_128.
                            super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                            ._M_impl.super__Vector_impl_data._M_finish + local_90._M_string_length))
        {
          in_R9 = &local_90.field_2;
          uVar12 = (allocator_type *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != in_R9) {
            uVar12 = local_90.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar12 <
              (allocator_type *)
              ((long)local_128.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                     ._M_impl.super__Vector_impl_data._M_finish + local_90._M_string_length))
          goto LAB_00e65da6;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_90,0,(char *)0x0,
                              (ulong)local_128.
                                     super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
        }
        else {
LAB_00e65da6:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_128,(ulong)local_90._M_dataplus._M_p);
        }
        local_108 = &local_f8;
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_f8 = *plVar3;
          uStack_f0 = puVar4[3];
        }
        else {
          local_f8 = *plVar3;
          local_108 = (long *)*puVar4;
        }
        drawTypes = (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                     *)(puVar4 + 1);
        local_100 = puVar4[1];
        *puVar4 = plVar3;
        (drawTypes->
        super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(undefined1 *)plVar3 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,
                          (ulong)(local_90.field_2._M_allocated_capacity + 1));
          drawTypes = extraout_RDX_01;
        }
        if ((pointer *)
            local_128.
            super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            &local_128.
             super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_128.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)local_128.
                                        super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          drawTypes = extraout_RDX_02;
        }
        if ((pointer *)
            local_e8.
            super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            &local_e8.
             super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_e8.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)local_e8.
                                        super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          drawTypes = extraout_RDX_03;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          drawTypes = extraout_RDX_04;
        }
        if ((*(long *)(this_01 + 8) != *(long *)this_01) ||
           (*(long *)(this_00 + 8) != *(long *)this_00)) {
          pPVar5 = (PartialUpdateTest *)operator_new(0x1b18);
          pTVar2 = local_a8;
          egl::anon_unknown_0::PartialUpdateTest::PartialUpdateTest
                    (pPVar5,(EglTestContext *)local_a8[1]._vptr_TestNode,
                     (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                      *)this_01,
                     (vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
                      *)this_00,(char *)local_108,in_R9->_M_local_buf);
          tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar5);
          drawTypes = extraout_RDX_05;
        }
        if (local_108 != &local_f8) {
          operator_delete(local_108,local_f8 + 1);
          drawTypes = extraout_RDX_06;
        }
        uVar11 = uVar11 + 1;
        this_01 = this_01 + 0x18;
      } while (uVar11 < local_58);
      uVar11 = local_60 + 1;
      this_01 = local_68 + 0x18;
    } while (uVar11 != local_70);
  }
  pPVar5 = (PartialUpdateTest *)operator_new(0x1b18);
  pTVar2 = local_a8;
  pEVar1 = (EglTestContext *)local_a8[1]._vptr_TestNode;
  pDVar6 = (pointer)operator_new(4);
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar6 + 1;
  *pDVar6 = DRAWTYPE_GLES2_RENDER;
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = pDVar6;
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_128.
       super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pDVar7 = (pointer)operator_new(4);
  local_e8.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar7 + 1;
  *pDVar7 = DRAWTYPE_GLES2_RENDER;
  local_e8.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = pDVar7;
  local_e8.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_e8.
       super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  egl::anon_unknown_0::PartialUpdateTest::PartialUpdateTest
            (pPVar5,pEVar1,&local_128,&local_e8,"render_outside_damage_region",in_R9->_M_local_buf);
  operator_delete(pDVar7,4);
  operator_delete(pDVar6,4);
  (pPVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__PartialUpdateTest_02114e60;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar5);
  pPVar5 = (PartialUpdateTest *)operator_new(0x1b18);
  pEVar1 = (EglTestContext *)pTVar2[1]._vptr_TestNode;
  pDVar6 = (pointer)operator_new(4);
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar6 + 1;
  *pDVar6 = DRAWTYPE_GLES2_RENDER;
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = pDVar6;
  local_128.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_128.
       super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  pDVar7 = (pointer)operator_new(4);
  local_e8.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar7 + 1;
  *pDVar7 = DRAWTYPE_GLES2_RENDER;
  local_e8.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_start = pDVar7;
  local_e8.
  super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_e8.
       super__Vector_base<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  egl::anon_unknown_0::PartialUpdateTest::PartialUpdateTest
            (pPVar5,pEVar1,&local_128,&local_e8,"render_before_set_damage_region",
             in_R9->_M_local_buf);
  operator_delete(pDVar7,4);
  operator_delete(pDVar6,4);
  (pPVar5->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__PartialUpdateTest_02114eb0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pPVar5);
  std::
  vector<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>,_std::allocator<std::vector<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::PartialUpdateTest::DrawType>_>_>_>
  ::~vector(&local_c8);
  return extraout_EAX;
}

Assistant:

void PartialUpdateTests::init (void)
{
	const PartialUpdateTest::DrawType clearRender[2] =
	{
		PartialUpdateTest::DRAWTYPE_GLES2_CLEAR,
		PartialUpdateTest::DRAWTYPE_GLES2_RENDER
	};

	const PartialUpdateTest::DrawType renderClear[2] =
	{
		PartialUpdateTest::DRAWTYPE_GLES2_RENDER,
		PartialUpdateTest::DRAWTYPE_GLES2_CLEAR
	};

	vector< vector<PartialUpdateTest::DrawType> > frameDrawTypes;
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> ());
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (1, PartialUpdateTest::DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (1, PartialUpdateTest::DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (2, PartialUpdateTest::DRAWTYPE_GLES2_CLEAR));
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (2, PartialUpdateTest::DRAWTYPE_GLES2_RENDER));
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (DE_ARRAY_BEGIN(clearRender), DE_ARRAY_END(clearRender)));
	frameDrawTypes.push_back(vector<PartialUpdateTest::DrawType> (DE_ARRAY_BEGIN(renderClear), DE_ARRAY_END(renderClear)));

	for (size_t evenNdx = 0; evenNdx < frameDrawTypes.size(); evenNdx++)
	{
		const vector<PartialUpdateTest::DrawType>& evenFrameDrawType = frameDrawTypes[evenNdx];

		for (size_t oddNdx = evenNdx; oddNdx < frameDrawTypes.size(); oddNdx++)
		{
			const vector<PartialUpdateTest::DrawType>&	oddFrameDrawType = frameDrawTypes[oddNdx];
			const std::string							name			 = generateTestName(oddFrameDrawType, evenFrameDrawType);
			if (oddFrameDrawType.size() == 0 && evenFrameDrawType.size() == 0)
				continue;

			addChild(new PartialUpdateTest(m_eglTestCtx, oddFrameDrawType, evenFrameDrawType, name.c_str(), ""));
		}
	}
	addChild(new RenderOutsideDamageRegion(m_eglTestCtx));
	addChild(new RenderBeforeSetDamageRegion(m_eglTestCtx));
}